

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeVST4LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  int iVar2;
  DecodeStatus DVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  switch(Insn >> 10 & 3) {
  case 0:
    uVar4 = Insn >> 2 & 4;
    iVar2 = 1;
    goto LAB_001544d3;
  case 1:
    uVar4 = Insn >> 1 & 8;
    uVar1 = Insn & 0x20;
    break;
  case 2:
    uVar4 = Insn >> 4 & 3;
    if (uVar4 != 0) {
      if (uVar4 == 3) {
        return MCDisassembler_Fail;
      }
      uVar4 = 4 << (sbyte)uVar4;
    }
    uVar1 = Insn & 0x40;
    break;
  case 3:
    return MCDisassembler_Fail;
  }
  iVar2 = 2 - (uint)(uVar1 == 0);
LAB_001544d3:
  uVar1 = Insn >> 0x10 & 0xf;
  uVar5 = Insn & 0xf;
  uVar6 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar1]);
  if (uVar5 == 0xf) {
    MCOperand_CreateImm0(Inst,(ulong)uVar4);
  }
  else {
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar1]);
    MCOperand_CreateImm0(Inst,(ulong)uVar4);
    if (uVar5 == 0xd) {
      uVar4 = 0;
    }
    else {
      uVar4 = (uint)GPRDecoderTable[uVar5];
    }
    MCOperand_CreateReg0(Inst,uVar4);
  }
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar6]);
  uVar6 = iVar2 + uVar6;
  uVar4 = 0;
  if (uVar6 < 0x20) {
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar6]);
    uVar4 = 3;
  }
  DVar3 = (*(code *)((long)&DAT_001d56c0 + (long)(int)(&DAT_001d56c0)[uVar4]))();
  return DVar3;
}

Assistant:

static DecodeStatus DecodeVST4LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 4;
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 8;
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			switch (fieldFromInstruction_4(Insn, 4, 2)) {
				case 0:
					align = 0; break;
				case 3:
					return MCDisassembler_Fail;
				default:
					align = 4 << fieldFromInstruction_4(Insn, 4, 2); break;
			}

			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+3*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}